

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FILE *__stream;
  size_t sVar5;
  long lVar6;
  undefined8 uVar7;
  wasm_name_t *name;
  wasm_externtype_t *pwVar8;
  undefined8 uVar9;
  wasm_func_t *func;
  wasm_externtype_t *current;
  size_t i;
  wasm_extern_vec_t exports;
  wasm_exporttype_vec_t export_types;
  wasm_instance_t *instance;
  wasm_extern_vec_t imports;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar3 = wasm_engine_new();
  uVar4 = wasm_store_new(uVar3);
  printf("Loading binary...\n");
  __stream = fopen("reflect.wasm","rb");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar5 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar5 == 1) {
      fclose(__stream);
      printf("Compiling module...\n");
      imports.data = (wasm_extern_t **)wasm_module_new(uVar4);
      if (imports.data == (wasm_extern_t **)0x0) {
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        wasm_byte_vec_delete(&module);
        printf("Instantiating module...\n");
        memset(&instance,0,0x10);
        lVar6 = wasm_instance_new(uVar4,imports.data,&instance,0);
        if (lVar6 == 0) {
          printf("> Error instantiating module!\n");
          argv_local._4_4_ = 1;
        }
        else {
          printf("Extracting export...\n");
          wasm_module_exports(imports.data,&exports.data);
          wasm_instance_exports(lVar6,&i);
          if ((wasm_extern_t **)i != exports.data) {
            __assert_fail("exports.size == export_types.size",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/reflect.c"
                          ,0x87,"int main(int, const char **)");
          }
          for (current = (wasm_externtype_t *)0x0; current < i; current = current + 1) {
            cVar1 = wasm_extern_kind(*(undefined8 *)(exports.size + (long)current * 8));
            uVar7 = wasm_exporttype_type(*(undefined8 *)(export_types.size + (long)current * 8));
            cVar2 = wasm_externtype_kind(uVar7);
            if (cVar1 != cVar2) {
              __assert_fail("wasm_extern_kind(exports.data[i]) == wasm_externtype_kind(wasm_exporttype_type(export_types.data[i]))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/reflect.c"
                            ,0x8b,"int main(int, const char **)");
            }
            printf("> export %zu ",current);
            name = (wasm_name_t *)
                   wasm_exporttype_name(*(undefined8 *)(export_types.size + (long)current * 8));
            print_name(name);
            printf("\n");
            printf(">> initial: ");
            pwVar8 = (wasm_externtype_t *)
                     wasm_exporttype_type(*(undefined8 *)(export_types.size + (long)current * 8));
            print_externtype(pwVar8);
            printf("\n");
            printf(">> current: ");
            pwVar8 = (wasm_externtype_t *)
                     wasm_extern_type(*(undefined8 *)(exports.size + (long)current * 8));
            print_externtype(pwVar8);
            wasm_externtype_delete(pwVar8);
            printf("\n");
            cVar1 = wasm_extern_kind(*(undefined8 *)(exports.size + (long)current * 8));
            if (cVar1 == '\0') {
              uVar7 = wasm_extern_as_func(*(undefined8 *)(exports.size + (long)current * 8));
              uVar9 = wasm_func_param_arity(uVar7);
              printf(">> in-arity: %zu",uVar9);
              uVar7 = wasm_func_result_arity(uVar7);
              printf(", out-arity: %zu\n",uVar7);
            }
          }
          wasm_module_delete(imports.data);
          wasm_instance_delete(lVar6);
          wasm_extern_vec_delete(&i);
          wasm_exporttype_vec_delete(&exports.data);
          printf("Shutting down...\n");
          wasm_store_delete(uVar4);
          wasm_engine_delete(uVar3);
          printf("Done.\n");
          argv_local._4_4_ = 0;
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("reflect.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_vec_t imports = WASM_EMPTY_VEC;
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  // Extract export.
  printf("Extracting export...\n");
  own wasm_exporttype_vec_t export_types;
  own wasm_extern_vec_t exports;
  wasm_module_exports(module, &export_types);
  wasm_instance_exports(instance, &exports);
  assert(exports.size == export_types.size);

  for (size_t i = 0; i < exports.size; ++i) {
    assert(wasm_extern_kind(exports.data[i]) ==
      wasm_externtype_kind(wasm_exporttype_type(export_types.data[i])));
    printf("> export %zu ", i);
    print_name(wasm_exporttype_name(export_types.data[i]));
    printf("\n");
    printf(">> initial: ");
    print_externtype(wasm_exporttype_type(export_types.data[i]));
    printf("\n");
    printf(">> current: ");
    own wasm_externtype_t* current = wasm_extern_type(exports.data[i]);
    print_externtype(current);
    wasm_externtype_delete(current);
    printf("\n");
    if (wasm_extern_kind(exports.data[i]) == WASM_EXTERN_FUNC) {
      wasm_func_t* func = wasm_extern_as_func(exports.data[i]);
      printf(">> in-arity: %zu", wasm_func_param_arity(func));
      printf(", out-arity: %zu\n", wasm_func_result_arity(func));
    }
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);
  wasm_extern_vec_delete(&exports);
  wasm_exporttype_vec_delete(&export_types);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}